

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeExV(void *ptr_id,ImGuiTreeNodeFlags flags,char *fmt,__va_list_tag *args)

{
  ImGuiID id;
  char *local_48;
  char *label_end;
  char *label;
  ImGuiWindow *window;
  __va_list_tag *args_local;
  char *fmt_local;
  void *pvStack_18;
  ImGuiTreeNodeFlags flags_local;
  void *ptr_id_local;
  
  window = (ImGuiWindow *)args;
  args_local = (__va_list_tag *)fmt;
  fmt_local._4_4_ = flags;
  pvStack_18 = ptr_id;
  label = (char *)GetCurrentWindow();
  if ((((ImGuiWindow *)label)->SkipItems & 1U) == 0) {
    ImFormatStringToTempBufferV(&label_end,&local_48,(char *)args_local,(__va_list_tag *)window);
    id = ImGuiWindow::GetID((ImGuiWindow *)label,pvStack_18);
    ptr_id_local._7_1_ = TreeNodeBehavior(id,fmt_local._4_4_,label_end,local_48);
  }
  else {
    ptr_id_local._7_1_ = false;
  }
  return ptr_id_local._7_1_;
}

Assistant:

bool ImGui::TreeNodeExV(const void* ptr_id, ImGuiTreeNodeFlags flags, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const char* label, *label_end;
    ImFormatStringToTempBufferV(&label, &label_end, fmt, args);
    return TreeNodeBehavior(window->GetID(ptr_id), flags, label, label_end);
}